

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fComputeShaderBuiltinVarTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::ComputeBuiltinVarCase::iterate(ComputeBuiltinVarCase *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  UVec3 *vec;
  uint *puVar3;
  uint *puVar4;
  uint uVar5;
  uint uVar6;
  TestLog *log;
  glUniform2uivFunc p_Var7;
  int i;
  int iVar8;
  deUint32 program;
  GLuint index;
  GLenum GVar9;
  GLint GVar10;
  uint uVar11;
  undefined8 *puVar12;
  undefined4 extraout_var;
  long lVar13;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  TestError *pTVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  IterateResult IVar19;
  ulong uVar20;
  ulong uVar21;
  pointer localSize;
  bool bVar22;
  UVec2 stride;
  UVec3 resValue;
  UVec3 globalSize;
  UVec3 refGlobalID;
  UVec3 refLocalID;
  Buffer outputBuffer;
  UVec3 refValue;
  ScopedLogSection section;
  InterfaceVariableInfo outVarInfo;
  Vector<unsigned_int,_3> res_1;
  UVec3 refGroupID;
  uint local_46c;
  uint local_468;
  uint local_464;
  uint local_460;
  GLuint local_450;
  int local_44c;
  Vector<unsigned_int,_3> local_448;
  string local_438;
  ulong local_418;
  undefined8 local_410;
  int local_408;
  undefined4 uStack_404;
  ulong local_400 [2];
  uint local_3ec;
  undefined8 local_3e8;
  uint local_3e0;
  undefined4 uStack_3dc;
  ulong local_3d8 [2];
  undefined1 local_3c8 [36];
  Vector<unsigned_int,_3> local_3a4;
  void *local_398;
  ScopedLogSection local_390;
  undefined1 local_388 [40];
  deUint32 local_360;
  undefined8 local_35c;
  deUint32 dStack_354;
  int iStack_350;
  undefined5 uStack_34c;
  undefined8 uStack_347;
  size_t local_338;
  undefined1 local_330 [8];
  int local_328 [26];
  ios_base local_2c0 [8];
  ios_base local_2b8 [264];
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  Functions *gl;
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_388._0_8_ = local_388 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_388,"Iteration","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  std::ostream::operator<<(local_330,this->m_subCaseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::ios_base::~ios_base(local_2c0);
  uVar21 = (long)(char **)local_3c8._8_8_ + local_388._8_8_;
  uVar20 = 0xf;
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    uVar20 = CONCAT71(local_388._17_7_,local_388[0x10]);
  }
  if (uVar20 < uVar21) {
    uVar20 = 0xf;
    if ((Functions *)local_3c8._0_8_ != (Functions *)(local_3c8 + 0x10)) {
      uVar20 = CONCAT44(local_3c8._20_4_,local_3c8._16_4_);
    }
    if (uVar20 < uVar21) goto LAB_01685931;
    puVar12 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_3c8,0,(char *)0x0,local_388._0_8_);
  }
  else {
LAB_01685931:
    puVar12 = (undefined8 *)std::__cxx11::string::_M_append(local_388,local_3c8._0_8_);
  }
  local_1b0 = (undefined1  [8])local_1a0;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 == paVar1) {
    local_1a0[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_1a0[0]._8_4_ = *(undefined4 *)(puVar12 + 3);
    local_1a0[0]._12_4_ = *(undefined4 *)((long)puVar12 + 0x1c);
  }
  else {
    local_1a0[0]._0_8_ = paVar1->_M_allocated_capacity;
    local_1b0 = (undefined1  [8])*puVar12;
  }
  local_1a8 = (_func_int **)puVar12[1];
  *puVar12 = paVar1;
  puVar12[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  local_3e8 = local_3d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Iteration ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
  std::ostream::operator<<(local_330,this->m_subCaseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
  std::ios_base::~ios_base(local_2c0);
  uVar21 = CONCAT44(uStack_404,local_408) + CONCAT44(uStack_3dc,local_3e0);
  uVar20 = 0xf;
  if (local_3e8 != local_3d8) {
    uVar20 = local_3d8[0];
  }
  if (uVar20 < uVar21) {
    uVar20 = 0xf;
    if (local_410 != local_400) {
      uVar20 = local_400[0];
    }
    if (uVar21 <= uVar20) {
      puVar12 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_410,0,(char *)0x0,(ulong)local_3e8);
      goto LAB_01685a94;
    }
  }
  puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_3e8,(ulong)local_410);
LAB_01685a94:
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  psVar2 = puVar12 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_438.field_2._M_allocated_capacity = *psVar2;
    local_438.field_2._8_8_ = puVar12[3];
  }
  else {
    local_438.field_2._M_allocated_capacity = *psVar2;
    local_438._M_dataplus._M_p = (pointer)*puVar12;
  }
  local_438._M_string_length = puVar12[1];
  *puVar12 = psVar2;
  puVar12[1] = 0;
  *(undefined1 *)psVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&local_390,log,(string *)local_1b0,&local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if (local_410 != local_400) {
    operator_delete(local_410,local_400[0] + 1);
  }
  if (local_3e8 != local_3d8) {
    operator_delete(local_3e8,local_3d8[0] + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  if ((Functions *)local_3c8._0_8_ != (Functions *)(local_3c8 + 0x10)) {
    operator_delete((void *)local_3c8._0_8_,CONCAT44(local_3c8._20_4_,local_3c8._16_4_) + 1);
  }
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,CONCAT71(local_388._17_7_,local_388[0x10]) + 1);
  }
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar8);
  localSize = (this->m_subCases).
              super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
              ._M_impl.super__Vector_impl_data._M_start + this->m_subCaseNdx;
  program = getProgram(this,&localSize->localSize);
  vec = &localSize->numWorkGroups;
  local_438._M_string_length = local_438._M_string_length & 0xffffffff00000000;
  local_438._M_dataplus._M_p = (pointer)0x0;
  lVar13 = 0;
  do {
    *(uint *)((long)&local_438._M_dataplus._M_p + lVar13 * 4) =
         (localSize->numWorkGroups).m_data[lVar13] * (localSize->localSize).m_data[lVar13];
    lVar13 = lVar13 + 1;
  } while (lVar13 != 3);
  local_450 = local_438._M_dataplus._M_p._4_4_ * (int)local_438._M_dataplus._M_p;
  local_44c = (int)local_438._M_dataplus._M_p;
  uVar17 = (localSize->localSize).m_data[1];
  uVar11 = (localSize->localSize).m_data[0];
  uVar15 = (localSize->localSize).m_data[2];
  uVar16 = (localSize->numWorkGroups).m_data[0];
  uVar5 = (localSize->numWorkGroups).m_data[1];
  uVar6 = (localSize->numWorkGroups).m_data[2];
  index = (*gl->getProgramResourceIndex)(program,0x92e5,"Output.result");
  local_388._0_8_ = local_388 + 0x10;
  local_388._8_8_ = 0;
  local_388[0x10] = '\0';
  local_388._32_8_ = &DAT_ffffffffffffffff;
  local_360 = 0xffffffff;
  local_35c._0_4_ = 0;
  local_35c._4_4_ = 0;
  dStack_354 = 0;
  iStack_350 = 0;
  uStack_34c = 0;
  uStack_347 = 0;
  glu::getProgramInterfaceVariableInfo(gl,program,0x92e5,index,(InterfaceVariableInfo *)local_388);
  uVar17 = iStack_350 * uVar17 * uVar11 * uVar15 * uVar16 * uVar5 * uVar6;
  iVar8 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper
            ((ObjectWrapper *)local_3c8,(Functions *)CONCAT44(extraout_var_00,iVar8),traits);
  if (local_35c._4_4_ != 0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,(char *)0x0,"outVarInfo.arraySize == 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
               ,0xdd);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1b0 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Number of work groups = ",0x18);
  tcu::operator<<((ostream *)&local_1a8,vec);
  local_330 = (undefined1  [8])
              tcu::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328,"Work group size = ",0x12)
  ;
  tcu::operator<<((ostream *)local_328,&localSize->localSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  (*gl->bindBuffer)(0x90d2,local_3c8._16_4_);
  uVar21 = (ulong)uVar17;
  (*gl->bufferData)(0x90d2,uVar21,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,local_3c8._16_4_);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xe5);
  (*gl->useProgram)(program);
  p_Var7 = gl->uniform2uiv;
  GVar10 = (*gl->getUniformLocation)(program,"u_stride");
  (*p_Var7)(GVar10,1,&local_450);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"Program setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xe9);
  (*gl->dispatchCompute)
            ((localSize->numWorkGroups).m_data[0],(localSize->numWorkGroups).m_data[1],
             (localSize->numWorkGroups).m_data[2]);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"glDispatchCompute() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xec);
  local_398 = (*gl->mapBufferRange)(0x90d2,0,uVar21,1);
  uVar17 = glu::getDataTypeScalarSize(this->m_varType);
  GVar9 = (*gl->getError)();
  glu::checkError(GVar9,"glMapBufferRange() failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
                  ,0xf4);
  if (local_398 == (void *)0x0) {
    pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar14,(char *)0x0,"ptr",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fComputeShaderBuiltinVarTests.cpp"
               ,0xf5);
    __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  uVar11 = (localSize->numWorkGroups).m_data[2];
  if (uVar11 == 0) {
    iVar8 = 0;
  }
  else {
    local_338 = (ulong)uVar17 << 2;
    uVar15 = (localSize->numWorkGroups).m_data[1];
    local_418 = 0;
    iVar8 = 0;
    uVar16 = uVar15;
    local_3ec = uVar17;
    do {
      if (uVar16 == 0) {
        uVar16 = 0;
      }
      else {
        uVar17 = vec->m_data[0];
        local_46c = 0;
        uVar11 = uVar17;
        do {
          if (uVar11 == 0) {
            uVar11 = 0;
          }
          else {
            uVar11 = (localSize->localSize).m_data[2];
            local_468 = 0;
            uVar15 = uVar11;
            do {
              if (uVar15 == 0) {
                uVar15 = 0;
              }
              else {
                uVar17 = (localSize->localSize).m_data[1];
                local_464 = 0;
                uVar15 = uVar17;
                do {
                  if (uVar15 == 0) {
                    uVar15 = 0;
                  }
                  else {
                    uVar11 = (localSize->localSize).m_data[0];
                    local_460 = 0;
                    do {
                      if (uVar11 == 0) {
                        uVar11 = 0;
                      }
                      else {
                        uVar17 = 0;
                        do {
                          local_1b0._4_4_ = local_46c;
                          local_1b0._0_4_ = local_468;
                          local_1a8 = (_func_int **)CONCAT44(local_1a8._4_4_,(int)local_418);
                          local_3e8 = (ulong *)CONCAT44(local_460,uVar17);
                          local_3e0 = local_464;
                          local_328[0] = 0;
                          local_330 = (undefined1  [8])0x0;
                          lVar13 = 0;
                          do {
                            local_328[lVar13 + -2] =
                                 (localSize->localSize).m_data[lVar13] *
                                 *(int *)(local_1b0 + lVar13 * 4);
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != 3);
                          local_408 = 0;
                          local_410 = (ulong *)0x0;
                          lVar13 = 0;
                          do {
                            *(int *)((long)&local_410 + lVar13 * 4) =
                                 *(int *)((long)&local_3e8 + lVar13 * 4) + local_328[lVar13 + -2];
                            lVar13 = lVar13 + 1;
                          } while (lVar13 != 3);
                          iVar18 = local_410._4_4_ * local_44c + local_408 * local_450 +
                                   (int)local_410;
                          (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
                                    (&local_3a4,this,vec,localSize,local_1b0,&local_3e8);
                          uVar11 = local_3ec;
                          local_448.m_data[2] = 0;
                          local_448.m_data[0] = 0;
                          local_448.m_data[1] = 0;
                          if ((int)local_3ec < 1) {
                            uVar11 = 0;
LAB_01686174:
                            if (local_3a4.m_data[0] != uVar11) {
                              bVar22 = false;
LAB_01686193:
                              if (iVar8 < 10) {
                                local_330 = (undefined1  [8])
                                            ((this->super_TestCase).super_TestCase.super_TestNode.
                                            m_testCtx)->m_log;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_328);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_328,
                                           "ERROR: comparison failed at offset ",0x23);
                                std::ostream::_M_insert<unsigned_long>((ulong)local_328);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_328,": expected ",0xb);
                                if (bVar22) {
                                  tcu::operator<<((ostream *)local_328,&local_3a4);
                                }
                                else {
                                  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
                                }
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_328,", got ",6);
                                if (bVar22) {
                                  tcu::operator<<((ostream *)local_328,&local_448);
                                }
                                else {
                                  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
                                }
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)local_330,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_016862cb:
                                std::__cxx11::ostringstream::~ostringstream
                                          ((ostringstream *)local_328);
                                std::ios_base::~ios_base(local_2b8);
                              }
                              else if (iVar8 == 10) {
                                local_330 = (undefined1  [8])
                                            ((this->super_TestCase).super_TestCase.super_TestNode.
                                            m_testCtx)->m_log;
                                std::__cxx11::ostringstream::ostringstream
                                          ((ostringstream *)local_328);
                                std::__ostream_insert<char,std::char_traits<char>>
                                          ((ostream *)local_328,"...",3);
                                tcu::MessageBuilder::operator<<
                                          ((MessageBuilder *)local_330,
                                           (EndMessageToken *)&tcu::TestLog::EndMessage);
                                goto LAB_016862cb;
                              }
                              iVar8 = iVar8 + 1;
                            }
                          }
                          else {
                            memcpy(&local_448,
                                   (void *)((long)local_398 + (ulong)(uint)(iStack_350 * iVar18)),
                                   local_338);
                            if (uVar11 != 3) {
                              uVar11 = local_448.m_data[0];
                              goto LAB_01686174;
                            }
                            bVar22 = true;
                            lVar13 = 0;
                            do {
                              while (!bVar22) {
                                lVar13 = lVar13 + 1;
                                bVar22 = false;
                                if (lVar13 == 3) {
                                  bVar22 = true;
                                  goto LAB_01686193;
                                }
                              }
                              puVar4 = local_3a4.m_data + lVar13;
                              puVar3 = local_448.m_data + lVar13;
                              bVar22 = *puVar4 == *puVar3;
                              lVar13 = lVar13 + 1;
                            } while (lVar13 != 3);
                            bVar22 = true;
                            if (*puVar4 != *puVar3) goto LAB_01686193;
                          }
                          uVar17 = uVar17 + 1;
                          uVar11 = (localSize->localSize).m_data[0];
                        } while (uVar17 < uVar11);
                        uVar17 = (localSize->localSize).m_data[1];
                      }
                      local_460 = local_460 + 1;
                    } while (local_460 < uVar17);
                    uVar11 = (localSize->localSize).m_data[2];
                    uVar15 = uVar17;
                  }
                  local_464 = local_464 + 1;
                } while (local_464 < uVar11);
                uVar17 = vec->m_data[0];
                uVar15 = uVar11;
              }
              local_468 = local_468 + 1;
            } while (local_468 < uVar17);
            uVar15 = (localSize->numWorkGroups).m_data[1];
            uVar11 = uVar17;
          }
          local_46c = local_46c + 1;
        } while (local_46c < uVar15);
        uVar11 = (localSize->numWorkGroups).m_data[2];
        uVar16 = uVar15;
      }
      uVar17 = (int)local_418 + 1;
      local_418 = (ulong)uVar17;
    } while (uVar17 < uVar11);
  }
  local_330 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_328);
  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," / ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_328," values passed",0xe);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_328);
  std::ios_base::~ios_base(local_2b8);
  if (0 < iVar8) {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Comparison failed");
  }
  (*gl->unmapBuffer)(0x90d2);
  iVar8 = this->m_subCaseNdx + 1;
  this->m_subCaseNdx = iVar8;
  iVar18 = (int)((ulong)((long)(this->m_subCases).
                               super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->m_subCases).
                              super__Vector_base<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase,_std::allocator<deqp::gles31::Functional::ComputeBuiltinVarCase::SubCase>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 3);
  IVar19 = STOP;
  if (SBORROW4(iVar8,iVar18 * -0x55555555) != iVar8 + iVar18 * 0x55555555 < 0) {
    IVar19 = (IterateResult)
             (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_testResult ==
             QP_TEST_RESULT_PASS);
  }
  glu::ObjectWrapper::~ObjectWrapper((ObjectWrapper *)local_3c8);
  if ((undefined1 *)local_388._0_8_ != local_388 + 0x10) {
    operator_delete((void *)local_388._0_8_,CONCAT71(local_388._17_7_,local_388[0x10]) + 1);
  }
  tcu::TestLog::endSection(local_390.m_log);
  return IVar19;
}

Assistant:

ComputeBuiltinVarCase::IterateResult ComputeBuiltinVarCase::iterate (void)
{
	const tcu::ScopedLogSection		section			(m_testCtx.getLog(), string("Iteration") + de::toString(m_subCaseNdx), string("Iteration ") + de::toString(m_subCaseNdx));
	const glw::Functions&			gl				= m_context.getRenderContext().getFunctions();
	const SubCase&					subCase			= m_subCases[m_subCaseNdx];
	const deUint32					program			= getProgram(subCase.localSize);

	const tcu::UVec3				globalSize		= subCase.localSize*subCase.numWorkGroups;
	const tcu::UVec2				stride			(globalSize[0]*globalSize[1], globalSize[0]);
	const deUint32					numInvocations	= subCase.localSize[0]*subCase.localSize[1]*subCase.localSize[2]*subCase.numWorkGroups[0]*subCase.numWorkGroups[1]*subCase.numWorkGroups[2];

	const deUint32					outVarIndex		= gl.getProgramResourceIndex(program, GL_BUFFER_VARIABLE, "Output.result");
	const InterfaceVariableInfo		outVarInfo		= getProgramInterfaceVariableInfo(gl, program, GL_BUFFER_VARIABLE, outVarIndex);
	const deUint32					bufferSize		= numInvocations*outVarInfo.arrayStride;
	Buffer							outputBuffer	(m_context.getRenderContext());

	TCU_CHECK(outVarInfo.arraySize == 0); // Unsized variable.

	m_testCtx.getLog() << TestLog::Message << "Number of work groups = " << subCase.numWorkGroups << TestLog::EndMessage
					   << TestLog::Message << "Work group size = " << subCase.localSize << TestLog::EndMessage;

	gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
	gl.bufferData(GL_SHADER_STORAGE_BUFFER, (glw::GLsizeiptr)bufferSize, DE_NULL, GL_STREAM_READ);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer setup failed");

	gl.useProgram(program);
	gl.uniform2uiv(gl.getUniformLocation(program, "u_stride"), 1, stride.getPtr());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Program setup failed");

	gl.dispatchCompute(subCase.numWorkGroups[0], subCase.numWorkGroups[1], subCase.numWorkGroups[2]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() failed");

	{
		const void*	ptr				= gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufferSize, GL_MAP_READ_BIT);
		int			numFailed		= 0;
		const int	numScalars		= getDataTypeScalarSize(m_varType);
		const int	maxLogPrints	= 10;

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");
		TCU_CHECK(ptr);

		for (deUint32 groupZ = 0; groupZ < subCase.numWorkGroups.z(); groupZ++)
		for (deUint32 groupY = 0; groupY < subCase.numWorkGroups.y(); groupY++)
		for (deUint32 groupX = 0; groupX < subCase.numWorkGroups.x(); groupX++)
		for (deUint32 localZ = 0; localZ < subCase.localSize.z(); localZ++)
		for (deUint32 localY = 0; localY < subCase.localSize.y(); localY++)
		for (deUint32 localX = 0; localX < subCase.localSize.x(); localX++)
		{
			const UVec3			refGroupID		(groupX, groupY, groupZ);
			const UVec3			refLocalID		(localX, localY, localZ);
			const UVec3			refGlobalID		= refGroupID * subCase.localSize + refLocalID;
			const deUint32		refOffset		= stride.x()*refGlobalID.z() + stride.y()*refGlobalID.y() + refGlobalID.x();
			const UVec3			refValue		= computeReference(subCase.numWorkGroups, subCase.localSize, refGroupID, refLocalID);

			const deUint32*		resPtr			= (const deUint32*)((const deUint8*)ptr + refOffset*outVarInfo.arrayStride);
			const UVec3			resValue		= readResultVec(resPtr, numScalars);

			if (!compareComps(refValue, resValue, numScalars))
			{
				if (numFailed < maxLogPrints)
					m_testCtx.getLog() << TestLog::Message << "ERROR: comparison failed at offset " << refOffset
														   << ": expected " << LogComps(refValue, numScalars)
														   << ", got " << LogComps(resValue, numScalars)
									   << TestLog::EndMessage;
				else if (numFailed == maxLogPrints)
					m_testCtx.getLog() << TestLog::Message << "..." << TestLog::EndMessage;

				numFailed += 1;
			}
		}

		m_testCtx.getLog() << TestLog::Message << (numInvocations-numFailed) << " / " << numInvocations << " values passed" << TestLog::EndMessage;

		if (numFailed > 0)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Comparison failed");

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
	}

	m_subCaseNdx += 1;
	return (m_subCaseNdx < (int)m_subCases.size() && m_testCtx.getTestResult() == QP_TEST_RESULT_PASS) ? CONTINUE : STOP;
}